

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  Compilation *pCVar1;
  bool bVar2;
  bool bVar3;
  NameSyntax *className;
  Type *pTVar4;
  Diagnostic *pDVar5;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this_00;
  MethodPrototypeSymbol *pMVar6;
  TransparentMemberSymbol *pTVar7;
  bitmask<slang::ast::MethodFlags> *this_01;
  Symbol *pSVar8;
  SubroutineSymbol *pSVar9;
  MethodPrototypeSymbol *pMVar10;
  Scope *scope;
  SubroutineSymbol *parentMethod;
  Symbol *this_02;
  ConstraintBlockSymbol *pCVar11;
  optional<slang::DiagCode> requireInterfaceClass;
  SourceRange SVar12;
  bool local_2d1;
  bool local_2c1;
  Type *possibleBase;
  Diagnostic *diag_2;
  ConstraintBlockSymbol *baseConstraint;
  Symbol *found;
  ClassType *currentBase;
  SubroutineSymbol *protoSub;
  Symbol *baseSub;
  MethodPrototypeSymbol *proto;
  Symbol *member_1;
  iterator __end2_1;
  iterator __begin2_1;
  iterator_range<slang::ast::Scope::iterator> *__range2_1;
  anon_class_8_1_81505f29 checkForOverride;
  TransparentMemberSymbol *wrapper;
  Diagnostic *diag_1;
  ConstraintBlockSymbol *cb;
  Diagnostic *diag;
  MethodPrototypeSymbol *local_118;
  MethodPrototypeSymbol *sub;
  Symbol *toWrap;
  templated_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_100;
  const_iterator it;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  iterator_range<slang::ast::Scope::iterator> *__range2;
  bool pureVirtualError;
  SymbolMap *scopeNameMap;
  Type *next;
  ClassType *local_80;
  ClassType *currBase;
  _Storage<slang::DiagCode,_true> local_46;
  undefined2 local_42;
  iterator local_40;
  ClassType *baseType;
  Compilation *comp;
  ASTContext *context_local;
  ExtendsClauseSyntax *extendsClause_local;
  ClassType *this_local;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB_local;
  
  insertCB_local.callback = (_func_void_intptr_t_Symbol_ptr *)insertCB.callable;
  this_local = (ClassType *)insertCB.callback;
  comp = (Compilation *)context;
  context_local = (ASTContext *)extendsClause;
  extendsClause_local = (ExtendsClauseSyntax *)this;
  baseType = (ClassType *)ASTContext::getCompilation(context);
  className = not_null<slang::syntax::NameSyntax_*>::operator*
                        ((not_null<slang::syntax::NameSyntax_*> *)&context_local->firstTempVar);
  pCVar1 = comp;
  std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_46._M_value);
  requireInterfaceClass.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
  super__Optional_payload_base<slang::DiagCode>._4_2_ = local_42;
  requireInterfaceClass.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
  super__Optional_payload_base<slang::DiagCode>._M_payload = local_46;
  local_80 = Lookup::findClass(className,(ASTContext *)pCVar1,requireInterfaceClass);
  local_40.current = (Symbol *)local_80;
  if (local_80 == (ClassType *)0x0) {
    pTVar4 = Compilation::getErrorType((Compilation *)baseType);
    this->baseClass = pTVar4;
  }
  else if ((local_80->isInterface & 1U) == 0) {
    while (pCVar1 = comp, local_80 != this) {
      pTVar4 = getBaseClass(local_80);
      if ((pTVar4 == (Type *)0x0) || (bVar2 = Type::isError(pTVar4), bVar2)) {
        this->baseClass = (Type *)local_40.current;
        this_00 = &Scope::getNameMap(&this->super_Scope)->
                   super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
        ;
        bVar2 = false;
        ___begin2 = Scope::members((Scope *)&local_40.current[1].name);
        __end2 = iterator_range<slang::ast::Scope::iterator>::begin
                           ((iterator_range<slang::ast::Scope::iterator> *)&__begin2);
        member = (Symbol *)
                 iterator_range<slang::ast::Scope::iterator>::end
                           ((iterator_range<slang::ast::Scope::iterator> *)&__begin2);
        goto LAB_006aa9eb;
      }
      pTVar4 = Type::getCanonicalType(pTVar4);
      local_80 = Symbol::as<slang::ast::ClassType>(&pTVar4->super_Symbol);
    }
    SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    pDVar5 = ASTContext::addDiag((ASTContext *)pCVar1,(DiagCode)0x20009,SVar12);
    Diagnostic::operator<<(pDVar5,(this->super_Type).super_Symbol.name);
    pTVar4 = Compilation::getErrorType((Compilation *)baseType);
    this->baseClass = pTVar4;
  }
  else {
    pTVar4 = Compilation::getErrorType((Compilation *)baseType);
    pCVar1 = comp;
    this->baseClass = pTVar4;
    SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    pDVar5 = ASTContext::addDiag((ASTContext *)pCVar1,(DiagCode)0x240006,SVar12);
    Diagnostic::operator<<(pDVar5,(local_40.current)->name);
  }
  return;
LAB_006aa9eb:
  bVar3 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
          ::operator!=((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                        *)&__end2,(iterator *)&member);
  if (!bVar3) {
    __range2_1 = (iterator_range<slang::ast::Scope::iterator> *)&stack0xffffffffffffffc0;
    ___begin2_1 = Scope::members(&this->super_Scope);
    __end2_1 = iterator_range<slang::ast::Scope::iterator>::begin
                         ((iterator_range<slang::ast::Scope::iterator> *)&__begin2_1);
    member_1 = (Symbol *)
               iterator_range<slang::ast::Scope::iterator>::end
                         ((iterator_range<slang::ast::Scope::iterator> *)&__begin2_1);
    do {
      bVar2 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
              ::operator!=((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                            *)&__end2_1,(iterator *)&member_1);
      if (!bVar2) {
        return;
      }
      pSVar8 = Scope::iterator::operator*(&__end2_1);
      if (pSVar8->kind == Subroutine) {
        pSVar9 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar8);
        const::$_0::operator()((__0 *)&__range2_1,pSVar9);
      }
      else if (pSVar8->kind == MethodPrototype) {
        pMVar10 = Symbol::as<slang::ast::MethodPrototypeSymbol>(pSVar8);
        const::$_0::operator()((__0 *)&__range2_1,pMVar10);
        pSVar8 = MethodPrototypeSymbol::getOverride(pMVar10);
        if ((pSVar8 != (Symbol *)0x0) &&
           (pSVar9 = MethodPrototypeSymbol::getSubroutine(pMVar10),
           pSVar9 != (SubroutineSymbol *)0x0)) {
          scope = not_null<const_slang::ast::Scope_*>::operator*
                            ((not_null<const_slang::ast::Scope_*> *)comp);
          parentMethod = Symbol::as<slang::ast::SubroutineSymbol>(pSVar8);
          SubroutineSymbol::checkVirtualMethodMatch(scope,parentMethod,pSVar9,true);
        }
      }
      else if (pSVar8->kind == ConstraintBlock) {
        found = local_40.current;
        while (this_02 = Scope::find((Scope *)&found[1].name,pSVar8->name), this_02 == (Symbol *)0x0
              ) {
          pTVar4 = getBaseClass((ClassType *)found);
          if ((pTVar4 == (Type *)0x0) || (bVar2 = Type::isError(pTVar4), bVar2)) goto LAB_006ab268;
          pTVar4 = Type::getCanonicalType(pTVar4);
          found = (Symbol *)Symbol::as<slang::ast::ClassType>(&pTVar4->super_Symbol);
        }
        if (((this_02->kind == ConstraintBlock) &&
            (pCVar11 = Symbol::as<slang::ast::ConstraintBlockSymbol>(this_02),
            (pCVar11->isPure & 1U) != 0)) &&
           (bVar2 = pCVar11->isStatic,
           pCVar11 = Symbol::as<slang::ast::ConstraintBlockSymbol>(pSVar8),
           (bVar2 & 1U) != (pCVar11->isStatic & 1U))) {
          pDVar5 = ASTContext::addDiag((ASTContext *)comp,(DiagCode)0x5c0006,pSVar8->location);
          Diagnostic::addNote(pDVar5,(DiagCode)0x40001,this_02->location);
        }
      }
LAB_006ab268:
      Scope::iterator::operator++(&__end2_1);
    } while( true );
  }
  pMVar10 = (MethodPrototypeSymbol *)Scope::iterator::operator*(&__end2);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    (&(pMVar10->super_Symbol).name);
  if (!bVar3) {
    local_2c1 = false;
    if ((pMVar10->super_Symbol).kind == Subroutine) {
      pSVar9 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)pMVar10);
      bitmask<slang::ast::MethodFlags>::bitmask
                ((bitmask<slang::ast::MethodFlags> *)((long)&it.current + 6),Constructor);
      local_2c1 = bitmask<slang::ast::MethodFlags>::has
                            (&pSVar9->flags,
                             (bitmask<slang::ast::MethodFlags> *)((long)&it.current + 6));
    }
    if (local_2c1 == false) {
      local_2d1 = false;
      if ((pMVar10->super_Symbol).kind == MethodPrototype) {
        pMVar6 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)pMVar10);
        bitmask<slang::ast::MethodFlags>::bitmask
                  ((bitmask<slang::ast::MethodFlags> *)((long)&it.current + 4),Constructor);
        local_2d1 = bitmask<slang::ast::MethodFlags>::has
                              (&pMVar6->flags,
                               (bitmask<slang::ast::MethodFlags> *)((long)&it.current + 4));
      }
      if (local_2d1 == false) {
        local_100.current =
             (EntryPointer)
             ska::detailv3::
             sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
             ::find(this_00,&(pMVar10->super_Symbol).name);
        toWrap = (Symbol *)
                 ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                 ::end(this_00);
        bVar3 = ska::detailv3::operator!=
                          (&local_100,
                           (templated_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                            *)&toWrap);
        if (!bVar3) {
          sub = pMVar10;
          if ((pMVar10->super_Symbol).kind == TransparentMember) {
            pTVar7 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)pMVar10);
            sub = (MethodPrototypeSymbol *)pTVar7->wrapped;
          }
          if (((this->isAbstract & 1U) == 0) && ((sub->super_Symbol).kind == MethodPrototype)) {
            local_118 = Symbol::as<slang::ast::MethodPrototypeSymbol>(&sub->super_Symbol);
            this_01 = &local_118->flags;
            bitmask<slang::ast::MethodFlags>::bitmask
                      ((bitmask<slang::ast::MethodFlags> *)((long)&diag + 4),Pure);
            diag._6_2_ = bitmask<slang::ast::MethodFlags>::operator&
                                   (this_01,(bitmask<slang::ast::MethodFlags> *)((long)&diag + 4));
            bVar3 = slang::bitmask::operator_cast_to_bool((bitmask *)((long)&diag + 6));
            pCVar1 = comp;
            if (bVar3) {
              if (!bVar2) {
                SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
                pDVar5 = ASTContext::addDiag((ASTContext *)pCVar1,(DiagCode)0x350006,SVar12);
                Diagnostic::operator<<(pDVar5,(this->super_Type).super_Symbol.name);
                Diagnostic::operator<<(pDVar5,(local_40.current)->name);
                Diagnostic::operator<<(pDVar5,(local_118->super_Symbol).name);
                Diagnostic::addNote(pDVar5,(DiagCode)0x40001,(local_118->super_Symbol).location);
                bVar2 = true;
              }
              goto LAB_006aaf4e;
            }
          }
          if ((((this->isAbstract & 1U) == 0) && ((sub->super_Symbol).kind == ConstraintBlock)) &&
             (pCVar11 = Symbol::as<slang::ast::ConstraintBlockSymbol>(&sub->super_Symbol),
             pCVar1 = comp, (pCVar11->isPure & 1U) != 0)) {
            if (!bVar2) {
              SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
              pDVar5 = ASTContext::addDiag((ASTContext *)pCVar1,(DiagCode)0x360006,SVar12);
              Diagnostic::operator<<(pDVar5,(this->super_Type).super_Symbol.name);
              Diagnostic::operator<<(pDVar5,(local_40.current)->name);
              Diagnostic::operator<<(pDVar5,(pCVar11->super_Symbol).name);
              Diagnostic::addNote(pDVar5,(DiagCode)0x40001,(pCVar11->super_Symbol).location);
              bVar2 = true;
            }
          }
          else {
            checkForOverride.baseType =
                 (ClassType **)
                 BumpAllocator::
                 emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                           ((BumpAllocator *)baseType,&sub->super_Symbol);
            function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                      ((function_ref<void_(const_slang::ast::Symbol_&)> *)&this_local,
                       (Symbol *)checkForOverride.baseType);
          }
        }
      }
      else {
        pMVar10 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)pMVar10);
        pSVar9 = MethodPrototypeSymbol::getSubroutine(pMVar10);
        this->baseConstructor = &pSVar9->super_Symbol;
      }
    }
    else {
      this->baseConstructor = (Symbol *)pMVar10;
    }
  }
LAB_006aaf4e:
  Scope::iterator::operator++(&__end2);
  goto LAB_006aa9eb;
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags & MethodFlags::Pure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.isPure) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase || possibleBase->isError())
                break;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine)
            checkForOverride(member.as<SubroutineSymbol>());
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            auto currentBase = baseType;
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.isPure &&
                            baseConstraint.isStatic !=
                                member.as<ConstraintBlockSymbol>().isStatic) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }
        }
    }
}